

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

void Cnf_DataPrint(Cnf_Dat_t *p,int fReadable)

{
  int *piVar1;
  FILE *__stream;
  uint local_44;
  int local_34;
  int i;
  int *pStop;
  int *pLit;
  FILE *pFile;
  int fReadable_local;
  Cnf_Dat_t *p_local;
  
  __stream = _stdout;
  fprintf(_stdout,"p cnf %d %d\n",(ulong)(uint)p->nVars,(ulong)(uint)p->nClauses);
  for (local_34 = 0; local_34 < p->nClauses; local_34 = local_34 + 1) {
    piVar1 = p->pClauses[local_34 + 1];
    for (pStop = p->pClauses[local_34]; pStop < piVar1; pStop = pStop + 1) {
      if (fReadable == 0) {
        local_44 = Cnf_Lit2Var(*pStop);
      }
      else {
        local_44 = Cnf_Lit2Var2(*pStop);
      }
      fprintf(__stream,"%d ",(ulong)local_44);
    }
    fprintf(__stream,"\n");
  }
  fprintf(__stream,"\n");
  return;
}

Assistant:

void Cnf_DataPrint( Cnf_Dat_t * p, int fReadable )
{
    FILE * pFile = stdout;
    int * pLit, * pStop, i;
    fprintf( pFile, "p cnf %d %d\n", p->nVars, p->nClauses );
    for ( i = 0; i < p->nClauses; i++ )
    {
        for ( pLit = p->pClauses[i], pStop = p->pClauses[i+1]; pLit < pStop; pLit++ )
            fprintf( pFile, "%d ", fReadable? Cnf_Lit2Var2(*pLit) : Cnf_Lit2Var(*pLit) );
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, "\n" );
}